

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt_env_infrastructure.cpp
# Opt level: O1

coop_repository_stats_t * __thiscall
so_5::env_infrastructures::default_mt::impl::mt_env_infrastructure_t::query_coop_repository_stats
          (coop_repository_stats_t *__return_storage_ptr__,mt_env_infrastructure_t *this)

{
  int iVar1;
  undefined4 extraout_var;
  coop_repository_stats_t local_40;
  
  iVar1 = (*(((this->m_coop_repo).m_final_dereg_chain.m_obj)->super_abstract_message_box_t).
            _vptr_abstract_message_box_t[0xe])();
  so_5::impl::coop_repository_basis_t::query_stats
            (&local_40,&(this->m_coop_repo).super_coop_repository_basis_t);
  __return_storage_ptr__->m_registered_coop_count = local_40.m_registered_coop_count;
  __return_storage_ptr__->m_deregistered_coop_count = local_40.m_deregistered_coop_count;
  __return_storage_ptr__->m_total_agent_count = local_40.m_total_agent_count;
  __return_storage_ptr__->m_final_dereg_coop_count = CONCAT44(extraout_var,iVar1);
  return __return_storage_ptr__;
}

Assistant:

environment_infrastructure_t::coop_repository_stats_t
mt_env_infrastructure_t::query_coop_repository_stats()
	{
		return m_coop_repo.query_stats();
	}